

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O2

EStatusCode __thiscall CFFPrimitiveReader::Read4ByteSigned(CFFPrimitiveReader *this,long *outValue)

{
  EStatusCode EVar1;
  unsigned_long buffer;
  
  EVar1 = Read4ByteUnsigned(this,&buffer);
  if (EVar1 == eSuccess) {
    *outValue = (long)(int)buffer;
    EVar1 = eSuccess;
  }
  else {
    EVar1 = eFailure;
  }
  return EVar1;
}

Assistant:

EStatusCode CFFPrimitiveReader::Read4ByteSigned(long& outValue)
{
	unsigned long buffer;
	EStatusCode status = Read4ByteUnsigned(buffer);

	if(status != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	outValue = (int)buffer; // very important to cast to 32, to get the sign right

	return PDFHummus::eSuccess;
}